

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  BtShared *pBVar3;
  long lVar4;
  Pgno parent;
  Pgno PVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined8 uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  u64 v;
  MemPage *pPage;
  u8 *puVar14;
  void *pvVar15;
  KeyInfo *pKVar16;
  u8 *__dest;
  uchar *pCell;
  int loc;
  int rc;
  UnpackedRecord r;
  uint local_bc;
  int local_b8;
  uint local_b4;
  u8 *local_b0;
  int local_a8;
  Pgno local_a4;
  KeyInfo *local_a0;
  BtreePayload *local_98;
  BtCursor *local_90;
  uint local_84;
  MemPage *local_80;
  BtShared *local_78;
  BtShared *local_70;
  uint *local_68;
  BtreePayload local_60;
  
  pBtree = pCur->pBtree;
  pBVar3 = pBtree->pBt;
  local_a8 = seekResult;
  if ((pCur->curFlags & 0x20) == 0) {
LAB_00160f7d:
    local_70 = pBVar3;
    if ((2 < pCur->eState) && (uVar6 = moveToRoot(pCur), (uVar6 & 0xffffffef) != 0)) {
      return uVar6;
    }
    if (pCur->pKeyInfo == (KeyInfo *)0x0) {
      if (pBtree->hasIncrblobCur != '\0') {
        invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
      }
      if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
        if ((seekResult == 0) &&
           (iVar7 = sqlite3BtreeTableMoveto(pCur,pX->nKey,(uint)flags >> 3 & 1,&local_a8),
           iVar7 != 0)) {
          return iVar7;
        }
      }
      else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
        iVar7 = btreeOverwriteCell(pCur,pX);
        return iVar7;
      }
    }
    else {
      if ((flags & 2U) == 0 && seekResult == 0) {
        if (pX->nMem == 0) {
          iVar7 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)flags >> 3 & 1,&local_a8);
        }
        else {
          local_60.nKey = (sqlite3_int64)pX->aMem;
          local_60.aMem._6_1_ = 0;
          local_60._34_1_ = 0;
          local_60.pKey = pCur->pKeyInfo;
          local_60.aMem._4_2_ = pX->nMem;
          iVar7 = sqlite3BtreeIndexMoveto(pCur,(UnpackedRecord *)&local_60,&local_a8);
        }
        if (iVar7 != 0) {
          return iVar7;
        }
        local_bc = 0;
        seekResult = local_a8;
      }
      if (seekResult == 0) {
        getCellInfo(pCur);
        lVar4 = (pCur->info).nKey;
        if (lVar4 == pX->nKey) {
          local_60.pData = pX->pKey;
          local_60.nData = (int)lVar4;
          local_60.nZero = 0;
          iVar7 = btreeOverwriteCell(pCur,&local_60);
          return iVar7;
        }
      }
    }
    pPage = pCur->pPage;
    if (pPage->nFree < 0) {
      if (1 < pCur->eState) {
        uVar9 = 0x12da9;
        goto LAB_001617dc;
      }
      iVar7 = btreeComputeFreeSpace(pPage);
      if (iVar7 != 0) {
        return iVar7;
      }
    }
    puVar14 = local_70->pTmpSpace;
    local_b0 = puVar14;
    if ((char)flags < '\0') {
      local_bc = 0;
      local_b4 = 4;
      if (4 < local_70->nPreformatSize) {
        local_b4 = local_70->nPreformatSize;
      }
      if ((local_70->autoVacuum != '\0') && (pPage->maxLocal < local_b4)) {
        (*pPage->xParseCell)(pPage,puVar14,(CellInfo *)&local_60);
        uVar6 = 0;
        uVar8 = local_bc;
        if ((uint)local_60.pData != local_60.pData._4_2_) {
          uVar6 = *(uint *)(local_b0 + ((ulong)local_b4 - 4));
          ptrmapPut(local_70,uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                             uVar6 << 0x18,'\x03',pPage->pgno,(int *)&local_bc);
          uVar6 = local_bc;
          uVar8 = local_bc;
        }
        goto LAB_001615c0;
      }
    }
    else {
      bVar1 = pPage->childPtrSize;
      local_b8 = flags;
      local_98 = pX;
      local_90 = pCur;
      if (pPage->intKey == '\0') {
        pvVar15 = pX->pKey;
        uVar11 = pX->nKey;
        if ((uint)uVar11 < 0x80) {
          puVar14[bVar1] = (u8)uVar11;
          uVar6 = 1;
        }
        else {
          uVar6 = sqlite3PutVarint(puVar14 + bVar1,(long)(int)(uint)uVar11);
          uVar6 = uVar6 & 0xff;
        }
        iVar7 = uVar6 + bVar1;
        v = uVar11 & 0xffffffff;
        puVar14 = local_b0;
      }
      else {
        uVar11 = (ulong)pX->nData;
        v = (long)pX->nZero + uVar11;
        pvVar15 = pX->pData;
        if ((uint)v < 0x80) {
          puVar14[bVar1] = (u8)v;
          uVar6 = 1;
        }
        else {
          uVar6 = sqlite3PutVarint(puVar14 + bVar1,v);
          uVar6 = uVar6 & 0xff;
        }
        uVar6 = uVar6 + bVar1;
        iVar7 = sqlite3PutVarint(puVar14 + uVar6,local_98->nKey);
        iVar7 = iVar7 + uVar6;
      }
      __dest = puVar14 + iVar7;
      iVar12 = (int)v;
      if ((int)(uint)pPage->maxLocal < iVar12) {
        uVar2 = pPage->minLocal;
        local_78 = pPage->pBt;
        local_a0 = (KeyInfo *)0x0;
        uVar6 = (iVar12 - (uint)uVar2) % (local_78->usableSize - 4) + (uint)uVar2;
        if ((int)(uint)pPage->maxLocal < (int)uVar6) {
          uVar6 = (uint)uVar2;
        }
        local_b4 = iVar7 + uVar6 + 4;
        local_68 = (uint *)(puVar14 + (int)(uVar6 + iVar7));
        local_a4 = 0;
        local_80 = pPage;
LAB_0016138a:
        do {
          uVar13 = (uint)v;
          uVar8 = uVar6;
          if ((int)uVar13 < (int)uVar6) {
            uVar8 = uVar13;
          }
          uVar10 = (uint)uVar11;
          if ((int)uVar10 < (int)uVar8) {
            if ((int)uVar10 < 1) {
              memset(__dest,0,(long)(int)uVar8);
            }
            else {
              memcpy(__dest,pvVar15,uVar11 & 0xffffffff);
              uVar8 = uVar10;
            }
          }
          else {
            memcpy(__dest,pvVar15,(long)(int)uVar8);
          }
          pBVar3 = local_78;
          parent = local_a4;
          flags = local_b8;
          v = (u64)(uVar13 - uVar8);
          if (uVar13 - uVar8 == 0 || (int)uVar13 < (int)uVar8) goto LAB_00161591;
          __dest = __dest + (int)uVar8;
          pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar8);
          uVar11 = (ulong)(uVar10 - uVar8);
          uVar6 = uVar6 - uVar8;
          if (uVar6 == 0) {
            local_60.pKey = (KeyInfo *)0x0;
            if (local_78->autoVacuum != '\0') {
              do {
                uVar8 = local_a4;
                local_a4 = uVar8 + 1;
                uVar6 = 0;
                if (1 < local_a4) {
                  iVar7 = (uVar8 - 1) - (uVar8 - 1) % (local_78->usableSize / 5 + 1);
                  uVar6 = iVar7 + (uint)(iVar7 + 1U == (uint)sqlite3PendingByte / local_78->pageSize
                                        ) + 2;
                }
              } while ((local_a4 == uVar6) ||
                      (uVar8 == (uint)sqlite3PendingByte / local_78->pageSize));
              local_a4 = uVar8 + 1;
            }
            uVar6 = allocateBtreePage(local_78,(MemPage **)&local_60,&local_a4,local_a4,'\0');
            PVar5 = local_a4;
            local_84 = uVar6;
            if ((pBVar3->autoVacuum == '\0') || (uVar6 != 0)) {
              pCur = local_90;
              pPage = local_80;
              pX = local_98;
              pKVar16 = local_a0;
              if (uVar6 == 0) goto LAB_001614fa;
            }
            else {
              ptrmapPut(local_78,local_a4,'\x04' - (parent == 0),parent,(int *)&local_84);
              pPage = local_80;
              uVar6 = local_84;
              pCur = local_90;
              pX = local_98;
              pKVar16 = local_a0;
              flags = local_b8;
              if (local_84 == 0) {
LAB_001614fa:
                *local_68 = PVar5 >> 0x18 | (PVar5 & 0xff0000) >> 8 | (PVar5 & 0xff00) << 8 |
                            PVar5 << 0x18;
                if (local_a0 != (KeyInfo *)0x0) {
                  sqlite3PagerUnrefNotNull((DbPage *)local_a0[2].aColl[0]);
                }
                local_a0 = (KeyInfo *)local_60.pKey;
                local_68 = *(uint **)((long)local_60.pKey + 0x50);
                *local_68 = 0;
                __dest = (u8 *)(*(long *)((long)local_60.pKey + 0x50) + 4);
                uVar6 = local_78->usableSize - 4;
                goto LAB_0016138a;
              }
              if ((KeyInfo *)local_60.pKey != (KeyInfo *)0x0) {
                sqlite3PagerUnrefNotNull
                          ((DbPage *)((KeyInfo *)((long)local_60.pKey + 0x50))->aColl[0]);
              }
            }
            uVar8 = uVar6;
            if (pKVar16 != (KeyInfo *)0x0) {
              sqlite3PagerUnrefNotNull((DbPage *)pKVar16[2].aColl[0]);
            }
            goto LAB_001615c0;
          }
        } while( true );
      }
      local_b4 = 4;
      if (4 < iVar7 + iVar12) {
        local_b4 = iVar7 + iVar12;
      }
      iVar7 = (int)uVar11;
      memcpy(__dest,pvVar15,(long)iVar7);
      uVar6 = 0;
      memset(__dest + iVar7,0,(long)(iVar12 - iVar7));
      pCur = local_90;
      pX = local_98;
      flags = local_b8;
      uVar8 = uVar6;
LAB_001615c0:
      local_bc = uVar8;
      if (uVar6 != 0) {
        return uVar6;
      }
    }
    uVar2 = pCur->ix;
    uVar6 = (uint)uVar2;
    if (local_a8 == 0) {
      if (pPage->nCell <= uVar2) {
        uVar9 = 0x12dcd;
        goto LAB_001617dc;
      }
      iVar7 = sqlite3PagerWrite(pPage->pDbPage);
      if (iVar7 != 0) {
        return iVar7;
      }
      pCell = pPage->aData +
              (CONCAT11(pPage->aCellIdx[(ulong)uVar2 * 2],pPage->aCellIdx[(ulong)uVar2 * 2 + 1]) &
              pPage->maskPage);
      if (pPage->leaf == '\0') {
        *(undefined4 *)local_b0 = *(undefined4 *)pCell;
      }
      local_b8 = flags;
      (*pPage->xParseCell)(pPage,pCell,(CellInfo *)&local_60);
      uVar8 = 0;
      if ((uint)local_60.pData != local_60.pData._4_2_) {
        uVar8 = clearCellOverflow(pPage,pCell,(CellInfo *)&local_60);
      }
      pCur->curFlags = pCur->curFlags & 0xfb;
      local_bc = uVar8;
      if (local_b4 == local_60.pData._6_2_) {
        if (((uint)local_60.pData == local_60.pData._4_2_) &&
           ((local_70->autoVacuum == '\0' || (local_b4 < pPage->minLocal)))) {
          if (pCell < pPage->aData + (ulong)pPage->hdrOffset + 10) {
            uVar9 = 0x12de8;
          }
          else {
            if (pCell + local_b4 <= pPage->aDataEnd) {
              memcpy(pCell,local_b0,(ulong)local_b4);
              return 0;
            }
            uVar9 = 0x12deb;
          }
          goto LAB_001617dc;
        }
      }
      dropCell(pPage,(uint)uVar2,(uint)local_60.pData._6_2_,(int *)&local_bc);
      flags = local_b8;
      if (local_bc != 0) {
        return local_bc;
      }
    }
    else if ((local_a8 < 0) && (pPage->nCell != 0)) {
      pCur->ix = uVar2 + 1;
      uVar6 = (uint)(ushort)(uVar2 + 1);
      pCur->curFlags = pCur->curFlags & 0xfd;
    }
    insertCell(pPage,uVar6,local_b0,local_b4,(u8 *)0x0,0,(int *)&local_bc);
    (pCur->info).nSize = 0;
    uVar6 = local_bc;
    if (pPage->nOverflow != '\0') {
      pCur->curFlags = pCur->curFlags & 0xfd;
      uVar6 = balance(pCur);
      pCur->pPage->nOverflow = '\0';
      pCur->eState = '\x01';
      if ((uVar6 == 0 & (byte)flags >> 1) == 1) {
        btreeReleaseAllCursorPages(pCur);
        uVar6 = 0;
        if (pCur->pKeyInfo != (KeyInfo *)0x0) {
          pvVar15 = sqlite3Malloc(pX->nKey);
          pCur->pKey = pvVar15;
          if (pvVar15 == (void *)0x0) {
            uVar6 = 7;
          }
          else {
            memcpy(pvVar15,pX->pKey,pX->nKey);
          }
        }
        pCur->eState = '\x03';
        pCur->nKey = pX->nKey;
      }
    }
  }
  else {
    iVar7 = saveAllCursors(pBVar3,pCur->pgnoRoot,pCur);
    if (iVar7 != 0) {
      return iVar7;
    }
    local_bc = 0;
    if ((seekResult == 0) || (-1 < pCur->iPage)) goto LAB_00160f7d;
    uVar9 = 0x12d2e;
LAB_001617dc:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    uVar6 = 0xb;
  }
  return uVar6;
LAB_00161591:
  uVar6 = 0;
  pCur = local_90;
  pPage = local_80;
  pX = local_98;
  uVar8 = uVar6;
  if (local_a0 != (KeyInfo *)0x0) {
    sqlite3PagerUnrefNotNull((DbPage *)local_a0[2].aColl[0]);
    pCur = local_90;
    pPage = local_80;
    pX = local_98;
    flags = local_b8;
  }
  goto LAB_001615c0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_BKPT;
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = pBt->nPreformatSize;
    if( szNew<4 ) szNew = 4;
    if( ISAUTOVACUUM && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
  }
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_BKPT;
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_BKPT;
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_BKPT;
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}